

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::FindHoles
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  CornerTable *pCVar5;
  pointer pIVar6;
  long lVar7;
  pointer piVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  pCVar5 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  pIVar6 = *(pointer *)((long)&(pCVar5->corner_to_vertex_map_).vector_ + 8);
  lVar7 = *(long *)&(pCVar5->corner_to_vertex_map_).vector_;
  uVar14 = 0;
  do {
    if (uVar14 == ((ulong)((long)pIVar6 - lVar7) >> 2 & 0xffffffff)) {
      return true;
    }
    bVar9 = CornerTable::IsDegenerated
                      ((this->corner_table_)._M_t.
                       super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                       .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                       (FaceIndex)(uint)((uVar14 & 0xffffffff) / 3));
    if ((!bVar9) &&
       (pCVar5 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
       *(int *)(*(long *)&(pCVar5->opposite_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               + uVar14 * 4) == -1)) {
      uVar10 = (int)uVar14 + 1;
      uVar3 = (int)uVar14 - 2;
      if (uVar10 % 3 != 0) {
        uVar3 = uVar10;
      }
      uVar13 = 0xffffffff;
      if (uVar3 != 0xffffffff) {
        uVar13 = (ulong)*(uint *)(*(long *)&(pCVar5->corner_to_vertex_map_).vector_ +
                                 (ulong)uVar3 * 4);
      }
      if ((this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] == -1) {
        iVar1 = *(int *)&(this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        iVar2 = *(int *)&(this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar3 = (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->visited_holes_,false);
        pCVar5 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        piVar8 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = uVar14 & 0xffffffff;
LAB_00134f71:
        if (piVar8[uVar13] == -1) {
          piVar8[uVar13] = (iVar1 - iVar2) * 8 + uVar3;
          iVar11 = (int)uVar12;
          uVar10 = 0xffffffff;
          if (iVar11 != -1) {
            uVar10 = iVar11 - 2;
            if ((iVar11 + 1U) % 3 != 0) {
              uVar10 = iVar11 + 1U;
            }
          }
          uVar12 = (ulong)uVar10;
          while (iVar11 = (int)uVar12, iVar11 != -1) {
            iVar4 = *(int *)(*(long *)&(pCVar5->opposite_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            + uVar12 * 4);
            if (iVar4 == -1) {
              uVar10 = iVar11 - 2;
              if ((iVar11 + 1U) % 3 != 0) {
                uVar10 = iVar11 + 1U;
              }
              uVar13 = 0xffffffff;
              if (uVar10 != 0xffffffff) {
                uVar13 = (ulong)*(uint *)(*(long *)&(pCVar5->corner_to_vertex_map_).vector_ +
                                         (ulong)uVar10 * 4);
              }
              goto LAB_00134f71;
            }
            uVar12 = (ulong)(iVar4 + 1U);
            if ((iVar4 + 1U) % 3 == 0) {
              uVar12 = (ulong)(iVar4 - 2);
            }
          }
          uVar13 = 0xffffffff;
          goto LAB_00134f71;
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindHoles() {
  // TODO(ostava): Add more error checking for invalid geometry data.
  const int num_corners = corner_table_->num_corners();
  // Go over all corners and detect non-visited open boundaries
  for (CornerIndex i(0); i < num_corners; ++i) {
    if (corner_table_->IsDegenerated(corner_table_->Face(i))) {
      continue;  // Don't process corners assigned to degenerated faces.
    }
    if (corner_table_->Opposite(i) == kInvalidCornerIndex) {
      // No opposite corner means no opposite face, so the opposite edge
      // of the corner is an open boundary.
      // Check whether we have already traversed the boundary.
      VertexIndex boundary_vert_id =
          corner_table_->Vertex(corner_table_->Next(i));
      if (vertex_hole_id_[boundary_vert_id.value()] != -1) {
        // The start vertex of the boundary edge is already assigned to an
        // open boundary. No need to traverse it again.
        continue;
      }
      // Else we found a new open boundary and we are going to traverse along it
      // and mark all visited vertices.
      const int boundary_id = static_cast<int>(visited_holes_.size());
      visited_holes_.push_back(false);

      CornerIndex corner_id = i;
      while (vertex_hole_id_[boundary_vert_id.value()] == -1) {
        // Mark the first vertex on the open boundary.
        vertex_hole_id_[boundary_vert_id.value()] = boundary_id;
        corner_id = corner_table_->Next(corner_id);
        // Look for the next attached open boundary edge.
        while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
          corner_id = corner_table_->Opposite(corner_id);
          corner_id = corner_table_->Next(corner_id);
        }
        // Id of the next vertex in the vertex on the hole.
        boundary_vert_id =
            corner_table_->Vertex(corner_table_->Next(corner_id));
      }
    }
  }
  return true;
}